

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_gcd(mbedtls_mpi *G,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_80 [8];
  mbedtls_mpi TB;
  mbedtls_mpi TA;
  mbedtls_mpi TG;
  size_t lzt;
  size_t lz;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *G_local;
  
  mbedtls_mpi_init((mbedtls_mpi *)&TA.p);
  mbedtls_mpi_init((mbedtls_mpi *)&TB.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_80);
  lz._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)&TB.p,A);
  if ((lz._4_4_ == 0) && (lz._4_4_ = mbedtls_mpi_copy((mbedtls_mpi *)local_80,B), lz._4_4_ == 0)) {
    lzt = mbedtls_mpi_lsb((mbedtls_mpi *)&TB.p);
    sVar2 = mbedtls_mpi_lsb((mbedtls_mpi *)local_80);
    if (sVar2 < lzt) {
      lzt = sVar2;
    }
    lz._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&TB.p,lzt);
    if ((lz._4_4_ == 0) &&
       (lz._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)local_80,lzt), lz._4_4_ == 0)) {
      local_80._0_4_ = 1;
      TB.p._0_4_ = 1;
      do {
        iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)&TB.p,0);
        if (iVar1 == 0) {
          lz._4_4_ = mbedtls_mpi_shift_l((mbedtls_mpi *)local_80,lzt);
          if (lz._4_4_ == 0) {
            lz._4_4_ = mbedtls_mpi_copy(G,(mbedtls_mpi *)local_80);
          }
          break;
        }
        sVar2 = mbedtls_mpi_lsb((mbedtls_mpi *)&TB.p);
        lz._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&TB.p,sVar2);
        if (lz._4_4_ != 0) break;
        sVar2 = mbedtls_mpi_lsb((mbedtls_mpi *)local_80);
        lz._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)local_80,sVar2);
        if (lz._4_4_ != 0) break;
        iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&TB.p,(mbedtls_mpi *)local_80);
        if (iVar1 < 0) {
          lz._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)local_80,(mbedtls_mpi *)local_80,
                                         (mbedtls_mpi *)&TB.p);
          if (lz._4_4_ != 0) break;
          lz._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)local_80,1);
        }
        else {
          lz._4_4_ = mbedtls_mpi_sub_abs((mbedtls_mpi *)&TB.p,(mbedtls_mpi *)&TB.p,
                                         (mbedtls_mpi *)local_80);
          if (lz._4_4_ != 0) break;
          lz._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)&TB.p,1);
        }
      } while (lz._4_4_ == 0);
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)&TA.p);
  mbedtls_mpi_free((mbedtls_mpi *)&TB.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_80);
  return lz._4_4_;
}

Assistant:

int mbedtls_mpi_gcd( mbedtls_mpi *G, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t lz, lzt;
    mbedtls_mpi TG, TA, TB;

    mbedtls_mpi_init( &TG ); mbedtls_mpi_init( &TA ); mbedtls_mpi_init( &TB );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TA, A ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) );

    lz = mbedtls_mpi_lsb( &TA );
    lzt = mbedtls_mpi_lsb( &TB );

    if( lzt < lz )
        lz = lzt;

    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TA, lz ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TB, lz ) );

    TA.s = TB.s = 1;

    while( mbedtls_mpi_cmp_int( &TA, 0 ) != 0 )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TA, mbedtls_mpi_lsb( &TA ) ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TB, mbedtls_mpi_lsb( &TB ) ) );

        if( mbedtls_mpi_cmp_mpi( &TA, &TB ) >= 0 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( &TA, &TA, &TB ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TA, 1 ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( &TB, &TB, &TA ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &TB, 1 ) );
        }
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_l( &TB, lz ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( G, &TB ) );

cleanup:

    mbedtls_mpi_free( &TG ); mbedtls_mpi_free( &TA ); mbedtls_mpi_free( &TB );

    return( ret );
}